

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::predict_or_learn<true>(data *sm,single_learner *base,example *ec)

{
  example *in_RDX;
  data *in_RSI;
  long in_RDI;
  example *in_stack_00000008;
  float pred;
  example *in_stack_00000078;
  data *in_stack_00000080;
  example *in_stack_00000158;
  data *in_stack_00000160;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t uVar1;
  
  make_marginal<true>(in_stack_00000160,in_stack_00000158);
  if ((*(byte *)(in_RDI + 0xc) & 1) == 0) {
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_RSI,in_RDX,
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if ((*(byte *)(in_RDI + 0x6948) & 1) != 0) {
      *(float *)(in_RDI + 0x694c) = (in_RDX->pred).scalar;
      compute_expert_loss<true>(in_RSI,in_RDX);
    }
    update_marginal(in_stack_00000080,in_stack_00000078);
  }
  else {
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_RSI,in_RDX,
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    uVar1 = (in_RDX->pred).multiclass;
    if ((*(byte *)(in_RDI + 0x6948) & 1) != 0) {
      *(uint32_t *)(in_RDI + 0x694c) = uVar1;
      compute_expert_loss<true>(in_RSI,in_RDX);
    }
    undo_marginal((data *)ec,in_stack_00000008);
    update_marginal(in_stack_00000080,in_stack_00000078);
    make_marginal<true>(in_stack_00000160,in_stack_00000158);
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_RSI,in_RDX,CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    (in_RDX->pred).multiclass = uVar1;
  }
  undo_marginal((data *)ec,in_stack_00000008);
  return;
}

Assistant:

void predict_or_learn(data& sm, LEARNER::single_learner& base, example& ec)
{
  make_marginal<is_learn>(sm, ec);
  if (is_learn)
    if (sm.update_before_learn)
    {
      base.predict(ec);
      float pred = ec.pred.scalar;
      if (sm.compete)
      {
        sm.feature_pred = pred;
        compute_expert_loss<is_learn>(sm, ec);
      }
      undo_marginal(sm, ec);
      update_marginal(sm, ec);  // update features before learning.
      make_marginal<is_learn>(sm, ec);
      base.learn(ec);
      ec.pred.scalar = pred;
    }
    else
    {
      base.learn(ec);
      if (sm.compete)
      {
        sm.feature_pred = ec.pred.scalar;
        compute_expert_loss<is_learn>(sm, ec);
      }
      update_marginal(sm, ec);
    }
  else
  {
    base.predict(ec);
    float pred = ec.pred.scalar;
    if (sm.compete)
    {
      sm.feature_pred = pred;
      compute_expert_loss<is_learn>(sm, ec);
    }
  }

  // undo marginalization
  undo_marginal(sm, ec);
}